

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_to_uni(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int32_t iVar6;
  vm_obj_id_t vVar7;
  wchar_t wVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  size_t idx;
  byte *p;
  size_t element_count;
  bool bVar13;
  vm_val_t ele_val;
  vm_val_t local_40;
  
  if (in_argc == (uint *)0x0) {
    bVar13 = true;
  }
  else {
    bVar13 = *in_argc == 0;
  }
  if (getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_to_uni();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_to_uni::desc);
  if (iVar5 == 0) {
    lVar10 = 1;
    if (!bVar13) {
      iVar6 = CVmBif::pop_long_val();
      lVar10 = (long)iVar6;
    }
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    pbVar9 = (byte *)(ulong)*(ushort *)str;
    p = (byte *)(str + 2);
    if (lVar10 < 0) {
      lVar11 = 0;
      if (pbVar9 != (byte *)0x0) {
        pbVar12 = p;
        do {
          pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) +
                              1;
          lVar11 = lVar11 + 1;
        } while (pbVar12 < p + (long)pbVar9);
      }
      lVar10 = lVar10 + lVar11 + 1;
    }
    if (bVar13) {
      element_count = 0;
      if (pbVar9 != (byte *)0x0) {
        pbVar12 = p;
        do {
          pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) +
                              1;
          element_count = element_count + 1;
        } while (pbVar12 < p + (long)pbVar9);
      }
      idx = 0;
      vVar7 = CVmObjList::create(0,element_count);
      if (element_count != 0) {
        pCVar1 = G_obj_table_X.pages_[vVar7 >> 0xc];
        do {
          local_40.val.intval = utf8_ptr::s_getch((char *)p);
          local_40.typ = VM_INT;
          CVmObjList::cons_set_element
                    ((CVmObjList *)((long)&pCVar1->ptr_ + (ulong)((vVar7 & 0xfff) * 0x18)),idx,
                     &local_40);
          idx = idx + 1;
          p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
        } while (element_count != idx);
      }
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar7;
    }
    else {
      bVar13 = pbVar9 != (byte *)0x0;
      lVar11 = lVar10;
      pbVar12 = p;
      if (1 < lVar10 && bVar13) {
        do {
          lVar10 = lVar11 + -1;
          p = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) + 1;
          pbVar9 = pbVar12 + ((long)pbVar9 - (long)p);
          bVar13 = pbVar9 != (byte *)0x0;
          if (lVar11 < 3) break;
          lVar11 = lVar10;
          pbVar12 = p;
        } while (pbVar9 != (byte *)0x0);
      }
      if ((lVar10 == 1) && (bVar13)) {
        wVar8 = utf8_ptr::s_getch((char *)p);
        retval->typ = VM_INT;
        (retval->val).intval = wVar8;
      }
      else {
        retval->typ = VM_NIL;
      }
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_to_uni(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    size_t bytelen;
    long idx = 1;
    utf8_ptr p;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* retrieve the index argument if present */
    if (argc >= 1)
        idx = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* set up a utf8 pointer to the string */
    p.set((char *)str);

    /* if the index is negative, it's an index from the end of the string */
    if (idx < 0)
        idx += p.len(bytelen) + 1;

    /* check for an index argument */
    if (argc >= 1)
    {
        /* skip through the string until we get to the desired index */
        for ( ; idx > 1 && bytelen != 0 ; --idx, p.inc(&bytelen)) ;

        /* check to see if we have a character available */
        if (idx == 1 && bytelen != 0)
        {
            /* the index is valid - return the character here */
            retval->set_int((long)p.getch());
        }
        else
        {
            /* 
             *   the index is past the end of the string or is less than 1
             *   - return nil to indicate that there's no character here 
             */
            retval->set_nil();
        }
    }
    else
    {
        size_t charlen;
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        size_t i;

        /* 
         *   There's no index argument - they want a list of all of the
         *   code points in the string.  First, get the number of
         *   characters in the string.  
         */
        charlen = p.len(bytelen);

        /* create a list to hold the results */
        lst_obj = CVmObjList::create(vmg_ FALSE, charlen);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list's elements to the unicode characters values */
        for (i = 0 ; i < charlen ; ++i, p.inc())
        {
            wchar_t ch;
            vm_val_t ele_val;

            /* get this character */
            ch = p.getch();

            /* set this list element */
            ele_val.set_int((long)ch);
            lst->cons_set_element(i, &ele_val);
        }

        /* return the list object */
        retval->set_obj(lst_obj);
    }
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}